

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object.hpp
# Opt level: O0

void __thiscall chaiscript::dispatch::Dynamic_Object::~Dynamic_Object(Dynamic_Object *this)

{
  Dynamic_Object *this_local;
  
  Catch::clara::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~map(&this->m_attrs);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit Dynamic_Object(std::string t_type_name)
          : m_type_name(std::move(t_type_name))
          , m_option_explicit(false) {
      }